

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl.c
# Opt level: O0

yajl_handle yajl_alloc(yajl_callbacks *callbacks,yajl_alloc_funcs *afs,void *ctx)

{
  size_t sVar1;
  yajl_handle pyVar2;
  yajl_buf pyVar3;
  uchar *puVar4;
  void *in_RDX;
  long *in_RSI;
  yajl_callbacks *in_RDI;
  yajl_alloc_funcs afsBuffer;
  yajl_handle hand;
  long local_48;
  yajl_alloc_funcs *in_stack_ffffffffffffffc0;
  long *local_18;
  
  local_18 = &local_48;
  if (in_RSI == (long *)0x0) {
    yajl_set_default_alloc_funcs((yajl_alloc_funcs *)&local_48);
  }
  else if (((*in_RSI == 0) || (in_RSI[1] == 0)) || (local_18 = in_RSI, in_RSI[2] == 0)) {
    return (yajl_handle)0x0;
  }
  pyVar2 = (yajl_handle)(*(code *)*local_18)(local_18[3],0x78);
  (pyVar2->alloc).malloc = (yajl_malloc_func)*local_18;
  (pyVar2->alloc).realloc = (yajl_realloc_func)local_18[1];
  (pyVar2->alloc).free = (yajl_free_func)local_18[2];
  (pyVar2->alloc).ctx = (void *)local_18[3];
  pyVar2->callbacks = in_RDI;
  pyVar2->ctx = in_RDX;
  pyVar2->lexer = (yajl_lexer)0x0;
  pyVar2->bytesConsumed = 0;
  pyVar3 = yajl_buf_alloc(in_stack_ffffffffffffffc0);
  pyVar2->decodeBuf = pyVar3;
  pyVar2->flags = 0;
  (pyVar2->stateStack).stack = (uchar *)0x0;
  (pyVar2->stateStack).size = 0;
  (pyVar2->stateStack).used = 0;
  (pyVar2->stateStack).yaf = &pyVar2->alloc;
  if ((pyVar2->stateStack).size == (pyVar2->stateStack).used) {
    (pyVar2->stateStack).size = (pyVar2->stateStack).size + 0x80;
    puVar4 = (uchar *)(*((pyVar2->stateStack).yaf)->realloc)
                                (((pyVar2->stateStack).yaf)->ctx,(pyVar2->stateStack).stack,
                                 (pyVar2->stateStack).size);
    (pyVar2->stateStack).stack = puVar4;
  }
  sVar1 = (pyVar2->stateStack).used;
  (pyVar2->stateStack).used = sVar1 + 1;
  (pyVar2->stateStack).stack[sVar1] = '\0';
  return pyVar2;
}

Assistant:

yajl_handle
yajl_alloc(const yajl_callbacks * callbacks,
           yajl_alloc_funcs * afs,
           void * ctx)
{
    yajl_handle hand = NULL;
    yajl_alloc_funcs afsBuffer;

    /* first order of business is to set up memory allocation routines */
    if (afs != NULL) {
        if (afs->malloc == NULL || afs->realloc == NULL || afs->free == NULL)
        {
            return NULL;
        }
    } else {
        yajl_set_default_alloc_funcs(&afsBuffer);
        afs = &afsBuffer;
    }

    hand = (yajl_handle) YA_MALLOC(afs, sizeof(struct yajl_handle_t));

    /* copy in pointers to allocation routines */
    memcpy((void *) &(hand->alloc), (void *) afs, sizeof(yajl_alloc_funcs));

    hand->callbacks = callbacks;
    hand->ctx = ctx;
    hand->lexer = NULL; 
    hand->bytesConsumed = 0;
    hand->decodeBuf = yajl_buf_alloc(&(hand->alloc));
    hand->flags	    = 0;
    yajl_bs_init(hand->stateStack, &(hand->alloc));
    yajl_bs_push(hand->stateStack, yajl_state_start);

    return hand;
}